

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob-test.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ArrayPtr<const_char> AVar5;
  ArrayPtr<char> AVar6;
  ArrayPtr<char> local_120;
  ArrayPtr<const_char> local_110;
  bool local_f9;
  undefined1 auStack_f8 [7];
  bool _kj_shouldLog_7;
  size_t local_f0;
  ArrayPtr<const_char> local_e8;
  bool local_d1;
  undefined1 local_d0 [7];
  bool _kj_shouldLog_6;
  Builder builder;
  undefined1 local_b0 [7];
  bool _kj_shouldLog_5;
  Reader text3;
  char c [4];
  bool _kj_shouldLog_4;
  Reader text2;
  uint local_80;
  bool local_79;
  char *pcStack_78;
  bool _kj_shouldLog_3;
  bool local_69;
  char *pcStack_68;
  bool _kj_shouldLog_2;
  bool local_5a;
  bool local_59;
  undefined1 local_58 [6];
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  Reader text;
  allocator<char> local_31;
  string local_30 [8];
  string str;
  TestCase34 *this_local;
  
  str.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"foo",&local_31);
  std::allocator<char>::~allocator(&local_31);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  Text::Reader::Reader((Reader *)local_58,pcVar3);
  bVar1 = kj::operator==("foo",(StringPtr *)local_58);
  if (!bVar1) {
    local_59 = kj::_::Debug::shouldLog(ERROR);
    while (local_59 != false) {
      kj::_::Debug::log<char_const(&)[35],char_const(&)[4],capnp::Text::Reader&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x26,ERROR,"\"failed: expected \" \"(\\\"foo\\\") == (text)\", \"foo\", text",
                 (char (*) [35])"failed: expected (\"foo\") == (text)",(char (*) [4])"foo",
                 (Reader *)local_58);
      local_59 = false;
    }
  }
  pcVar3 = kj::StringPtr::cStr((StringPtr *)local_58);
  iVar2 = strcmp("foo",pcVar3);
  if (iVar2 != 0) {
    local_5a = kj::_::Debug::shouldLog(ERROR);
    while (local_5a != false) {
      pcStack_68 = kj::StringPtr::cStr((StringPtr *)local_58);
      kj::_::Debug::log<char_const(&)[51],char_const(&)[4],char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x27,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"foo\\\", text.cStr()) == 0\", \"foo\", text.cStr()"
                 ,(char (*) [51])"failed: expected ::strcmp(\"foo\", text.cStr()) == 0",
                 (char (*) [4])"foo",&stack0xffffffffffffff98);
      local_5a = false;
    }
  }
  pcVar3 = kj::StringPtr::begin((StringPtr *)local_58);
  iVar2 = strcmp("foo",pcVar3);
  if (iVar2 != 0) {
    local_69 = kj::_::Debug::shouldLog(ERROR);
    while (local_69 != false) {
      pcStack_78 = kj::StringPtr::begin((StringPtr *)local_58);
      kj::_::Debug::log<char_const(&)[52],char_const(&)[4],char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x28,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"foo\\\", text.begin()) == 0\", \"foo\", text.begin()"
                 ,(char (*) [52])"failed: expected ::strcmp(\"foo\", text.begin()) == 0",
                 (char (*) [4])"foo",&stack0xffffffffffffff88);
      local_69 = false;
    }
  }
  sVar4 = kj::StringPtr::size((StringPtr *)local_58);
  if (sVar4 != 3) {
    local_79 = kj::_::Debug::shouldLog(ERROR);
    while (local_79 != false) {
      local_80 = 3;
      text2.super_StringPtr.content.size_ = kj::StringPtr::size((StringPtr *)local_58);
      kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x29,ERROR,"\"failed: expected \" \"(3u) == (text.size())\", 3u, text.size()",
                 (char (*) [39])"failed: expected (3u) == (text.size())",&local_80,
                 &text2.super_StringPtr.content.size_);
      local_79 = false;
    }
  }
  Text::Reader::Reader((Reader *)c,"bar");
  bVar1 = kj::operator==("bar",(StringPtr *)c);
  if (!bVar1) {
    text3.super_StringPtr.content.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)text3.super_StringPtr.content.size_._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[36],char_const(&)[4],capnp::Text::Reader&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x2c,ERROR,"\"failed: expected \" \"(\\\"bar\\\") == (text2)\", \"bar\", text2",
                 (char (*) [36])"failed: expected (\"bar\") == (text2)",(char (*) [4])0x4b5bf5,
                 (Reader *)c);
      text3.super_StringPtr.content.size_._7_1_ = false;
    }
  }
  text3.super_StringPtr.content.size_._0_4_ = 0x7a6162;
  Text::Reader::Reader((Reader *)local_b0,(char *)&text3.super_StringPtr.content.size_);
  bVar1 = kj::operator==("baz",(StringPtr *)local_b0);
  if (!bVar1) {
    builder.content.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)builder.content.size_._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[36],char_const(&)[4],capnp::Text::Reader&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x30,ERROR,"\"failed: expected \" \"(\\\"baz\\\") == (text3)\", \"baz\", text3",
                 (char (*) [36])"failed: expected (\"baz\") == (text3)",(char (*) [4])0x4bdece,
                 (Reader *)local_b0);
      builder.content.size_._7_1_ = false;
    }
  }
  Text::Builder::Builder((Builder *)local_d0,(char *)&text3.super_StringPtr.content.size_,3);
  bVar1 = capnp::operator==("baz",(Builder *)local_d0);
  if (!bVar1) {
    local_d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_d1 != false) {
      kj::_::Debug::log<char_const(&)[38],char_const(&)[4],capnp::Text::Builder&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x33,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (builder)\", \"baz\", builder",
                 (char (*) [38])"failed: expected (\"baz\") == (builder)",(char (*) [4])0x4bdece,
                 (Builder *)local_d0);
      local_d1 = false;
    }
  }
  local_e8 = kj::arrayPtr<char_const>("az",2);
  _auStack_f8 = Text::Builder::slice((Builder *)local_d0,1,3);
  bVar1 = kj::ArrayPtr<char_const>::operator==
                    ((ArrayPtr<char_const> *)&local_e8,(ArrayPtr<char> *)auStack_f8);
  if (!bVar1) {
    local_f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_f9 != false) {
      AVar5 = kj::arrayPtr<char_const>("az",2);
      local_110 = AVar5;
      AVar6 = Text::Builder::slice((Builder *)local_d0,1,3);
      local_120 = AVar6;
      kj::_::Debug::log<char_const(&)[66],kj::ArrayPtr<char_const>,kj::ArrayPtr<char>>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x35,ERROR,
                 "\"failed: expected \" \"(kj::arrayPtr(\\\"az\\\", 2)) == (builder.slice(1, 3))\", kj::arrayPtr(\"az\", 2), builder.slice(1, 3)"
                 ,(char (*) [66])
                  "failed: expected (kj::arrayPtr(\"az\", 2)) == (builder.slice(1, 3))",&local_110,
                 &local_120);
      local_f9 = false;
    }
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Blob, Text) {
  std::string str = "foo";
  Text::Reader text = str.c_str();

  EXPECT_EQ("foo", text);
  EXPECT_STREQ("foo", text.cStr());
  EXPECT_STREQ("foo", text.begin());
  EXPECT_EQ(3u, text.size());

  Text::Reader text2 = "bar";
  EXPECT_EQ("bar", text2);

  char c[4] = "baz";
  Text::Reader text3(c);
  EXPECT_EQ("baz", text3);

  Text::Builder builder(c, 3);
  EXPECT_EQ("baz", builder);

  EXPECT_EQ(kj::arrayPtr("az", 2), builder.slice(1, 3));
}